

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_node::set_value(xml_node *this,char_t *rhs,size_t sz)

{
  uint local_3c;
  xml_node_type type_;
  size_t sz_local;
  char_t *rhs_local;
  xml_node *this_local;
  
  if (this->_root == (xml_node_struct *)0x0) {
    local_3c = 0;
  }
  else {
    local_3c = (uint)this->_root->header & 0xf;
  }
  if ((((local_3c == 3) || (local_3c == 4)) || (local_3c == 5)) ||
     ((local_3c == 6 || (local_3c == 8)))) {
    this_local._7_1_ =
         impl::(anonymous_namespace)::strcpy_insitu<char*,unsigned_long>
                   (&this->_root->value,&this->_root->header,0x10,rhs,sz);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

PUGI__FN bool xml_node::set_value(const char_t* rhs, size_t sz)
	{
		xml_node_type type_ = _root ? PUGI__NODETYPE(_root) : node_null;

		if (type_ != node_pcdata && type_ != node_cdata && type_ != node_comment && type_ != node_pi && type_ != node_doctype)
			return false;

		return impl::strcpy_insitu(_root->value, _root->header, impl::xml_memory_page_value_allocated_mask, rhs, sz);
	}